

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

bool __thiscall duckdb::WindowLocalSourceState::TryAssignTask(WindowLocalSourceState *this)

{
  TaskPtr *this_00;
  bool bVar1;
  
  this_00 = &this->task;
  if ((this->task).ptr != (WindowSourceTask *)0x0) {
    optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid(this_00);
    if (this_00->ptr->stage == GETDATA) {
      ReleaseLocalStates(this);
    }
  }
  ::std::
  __uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
           *)&this->scanner,(pointer)0x0);
  bVar1 = WindowGlobalSourceState::TryNextTask(this->gsource,this_00);
  return bVar1;
}

Assistant:

bool WindowLocalSourceState::TryAssignTask() {
	D_ASSERT(TaskFinished());
	if (task && task->stage == WindowGroupStage::GETDATA) {
		// If this state completed the last block in the previous iteration,
		// release our local state memory.
		ReleaseLocalStates();
	}
	// Because downstream operators may be using our internal buffers,
	// we can't "finish" a task until we are about to get the next one.

	// Scanner first, as it may be referencing sort blocks in the hash group
	scanner.reset();

	return gsource.TryNextTask(task);
}